

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O3

int32_t intersect_vector16_inplace(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b)

{
  ushort uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 local_68 [32];
  size_t local_40;
  size_t local_38;
  
  uVar7 = s_a & 0xfffffffffffffff8;
  uVar9 = s_b & 0xfffffffffffffff8;
  if (uVar9 == 0 || uVar7 == 0) {
    uVar6 = 0;
    uVar7 = 0;
    lVar10 = 0;
  }
  else {
    auVar3 = vlddqu_avx(*(undefined1 (*) [16])A);
    auVar14 = ZEXT1664(auVar3);
    auVar3 = vlddqu_avx(*(undefined1 (*) [16])B);
    auVar13 = ZEXT1664(auVar3);
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    local_68 = auVar12._0_32_;
    lVar11 = 0;
    uVar6 = 0;
    uVar8 = 0;
    lVar10 = 0;
    while ((local_38 = s_b, local_40 = s_a, A[uVar8] == 0 || (B[uVar6] == 0))) {
      vpcmpestrm_avx(auVar13._0_16_,auVar14._0_16_,1);
      auVar3 = vpshufb_avx(auVar14._0_16_,
                           *(undefined1 (*) [16])(shuffle_mask16 + (long)auVar12._0_4_ * 0x10));
      *(undefined1 (*) [16])(local_68 + lVar11 * 2) = auVar3;
      lVar11 = lVar11 + (ulong)(uint)POPCOUNT(auVar12._0_4_);
      uVar2 = A[uVar8 + 7];
      uVar1 = B[uVar6 + 7];
      if (uVar2 <= uVar1) {
        uVar8 = uVar8 + 8;
        auVar3 = local_68._0_16_;
        *(undefined1 (*) [16])(A + lVar10) = local_68._0_16_;
        local_68._0_16_ = ZEXT816(0);
        lVar10 = lVar10 + lVar11;
        if (uVar8 == uVar7) goto LAB_0010c9cc;
        auVar4 = vlddqu_avx(*(undefined1 (*) [16])(A + uVar8));
        auVar14 = ZEXT1664(auVar4);
        lVar11 = 0;
      }
      auVar12 = ZEXT1664(auVar3);
      if (uVar1 <= uVar2) {
        uVar6 = uVar6 + 8;
        uVar5 = uVar9;
        if (uVar6 == uVar9) goto LAB_0010c998;
        auVar3 = vlddqu_avx(*(undefined1 (*) [16])(B + uVar6));
        auVar13 = ZEXT1664(auVar3);
      }
    }
    uVar5 = uVar6;
    if (uVar6 < uVar9 && uVar8 < uVar7) {
      while( true ) {
        uVar2 = B[uVar6 + 7];
        do {
          vpcmpistrm_avx(auVar13._0_16_,auVar14._0_16_,1);
          auVar3 = vpshufb_avx(auVar14._0_16_,
                               *(undefined1 (*) [16])(shuffle_mask16 + (long)auVar12._0_4_ * 0x10));
          *(undefined1 (*) [16])(local_68 + lVar11 * 2) = auVar3;
          lVar11 = (ulong)(uint)POPCOUNT(auVar12._0_4_) + lVar11;
          uVar1 = A[uVar8 + 7];
          if (uVar1 <= uVar2) {
            uVar8 = uVar8 + 8;
            auVar3 = local_68._0_16_;
            *(undefined1 (*) [16])(A + lVar10) = local_68._0_16_;
            local_68._0_16_ = ZEXT416(0) << 0x40;
            lVar10 = lVar10 + lVar11;
            if (uVar8 == uVar7) goto LAB_0010c9cc;
            auVar4 = vlddqu_avx(*(undefined1 (*) [16])(A + uVar8));
            auVar14 = ZEXT1664(auVar4);
            lVar11 = 0;
          }
          auVar12 = ZEXT1664(auVar3);
        } while (uVar1 < uVar2);
        uVar6 = uVar6 + 8;
        uVar5 = uVar9;
        if (uVar6 == uVar9) break;
        auVar3 = vlddqu_avx(*(undefined1 (*) [16])(B + uVar6));
        auVar13 = ZEXT1664(auVar3);
      }
    }
LAB_0010c998:
    uVar7 = uVar8;
    uVar6 = uVar5;
    if (lVar11 == 0) {
LAB_0010c9cc:
      lVar11 = 0;
    }
    else {
      memcpy(A + lVar10,local_68,lVar11 * 2);
      lVar10 = lVar10 + lVar11;
    }
    uVar7 = uVar7 + lVar11;
    s_b = local_38;
    s_a = local_40;
  }
  while ((uVar7 < s_a && (uVar6 < s_b))) {
    uVar2 = A[uVar7];
    if (uVar2 < B[uVar6]) {
      uVar7 = uVar7 + 1;
    }
    else {
      if (uVar2 <= B[uVar6]) {
        A[lVar10] = uVar2;
        lVar10 = lVar10 + 1;
        uVar7 = uVar7 + 1;
      }
      uVar6 = uVar6 + 1;
    }
  }
  return (int32_t)lVar10;
}

Assistant:

int32_t intersect_vector16_inplace(uint16_t *__restrict__ A, size_t s_a,
                                   const uint16_t *__restrict__ B, size_t s_b) {
    size_t count = 0;
    size_t i_a = 0, i_b = 0;
    const int vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    __m128i v_a, v_b;
    if ((i_a < st_a) && (i_b < st_b)) {
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        __m128i tmp[2] = {_mm_setzero_si128()};
        size_t tmp_count = 0;
        while ((A[i_a] == 0) || (B[i_b] == 0)) {
            const __m128i res_v = _mm_cmpestrm(
                v_b, vectorlength, v_a, vectorlength,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            const int r = _mm_extract_epi32(res_v, 0);
            __m128i sm16 = _mm_loadu_si128((const __m128i *)shuffle_mask16 + r);
            __m128i p = _mm_shuffle_epi8(v_a, sm16);
            _mm_storeu_si128((__m128i *)&((uint16_t *)tmp)[tmp_count], p);
            tmp_count += _mm_popcnt_u32(r);
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                _mm_storeu_si128((__m128i *)&A[count], tmp[0]);
                _mm_storeu_si128(tmp, _mm_setzero_si128());
                count += tmp_count;
                tmp_count = 0;
                i_a += vectorlength;
                if (i_a == st_a) break;
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        if ((i_a < st_a) && (i_b < st_b)) {
            while (true) {
                const __m128i res_v = _mm_cmpistrm(
                    v_b, v_a,
                    _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
                const int r = _mm_extract_epi32(res_v, 0);
                __m128i sm16 =
                    _mm_loadu_si128((const __m128i *)shuffle_mask16 + r);
                __m128i p = _mm_shuffle_epi8(v_a, sm16);
                _mm_storeu_si128((__m128i *)&((uint16_t *)tmp)[tmp_count], p);
                tmp_count += _mm_popcnt_u32(r);
                const uint16_t a_max = A[i_a + vectorlength - 1];
                const uint16_t b_max = B[i_b + vectorlength - 1];
                if (a_max <= b_max) {
                    _mm_storeu_si128((__m128i *)&A[count], tmp[0]);
                    _mm_storeu_si128(tmp, _mm_setzero_si128());
                    count += tmp_count;
                    tmp_count = 0;
                    i_a += vectorlength;
                    if (i_a == st_a) break;
                    v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
                }
                if (b_max <= a_max) {
                    i_b += vectorlength;
                    if (i_b == st_b) break;
                    v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
                }
            }
        }
        // tmp_count <= 8, so this does not affect efficiency so much
        for (size_t i = 0; i < tmp_count; i++) {
            A[count] = ((uint16_t *)tmp)[i];
            count++;
        }
        i_a += tmp_count;  // We can at least jump pass $tmp_count elements in A
    }
    // intersect the tail using scalar intersection
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (a < b) {
            i_a++;
        } else if (b < a) {
            i_b++;
        } else {
            A[count] = a;  //==b;
            count++;
            i_a++;
            i_b++;
        }
    }
    return (int32_t)count;
}